

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O2

void __thiscall dg::debug::DG2Dot<dg::LLVMNode>::dump_nodes(DG2Dot<dg::LLVMNode> *this)

{
  DependenceGraph<dg::LLVMNode> *pDVar1;
  element_type *peVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  LLVMNode *pLVar5;
  pair<std::_Rb_tree_iterator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_bool>
  pVar6;
  __shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_48;
  DependenceGraph<dg::LLVMNode> *local_38;
  
  std::operator<<((ostream *)&this->out,"\t/* nodes */\n");
  pDVar1 = this->dg;
  for (p_Var4 = (pDVar1->nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pDVar1->nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pLVar5 = (LLVMNode *)p_Var4[1]._M_parent;
    dump_node(this,pLVar5,1,(char *)0x0);
    for (p_Var3 = (pLVar5->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                  subgraphs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(pLVar5->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).subgraphs._M_t.
         _M_impl.super__Rb_tree_header; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      local_48._M_ptr = *(element_type **)(p_Var3 + 1);
      std::
      _Rb_tree<dg::DependenceGraph<dg::LLVMNode>*,dg::DependenceGraph<dg::LLVMNode>*,std::_Identity<dg::DependenceGraph<dg::LLVMNode>*>,std::less<dg::DependenceGraph<dg::LLVMNode>*>,std::allocator<dg::DependenceGraph<dg::LLVMNode>*>>
      ::_M_insert_unique<dg::DependenceGraph<dg::LLVMNode>*>
                ((_Rb_tree<dg::DependenceGraph<dg::LLVMNode>*,dg::DependenceGraph<dg::LLVMNode>*,std::_Identity<dg::DependenceGraph<dg::LLVMNode>*>,std::less<dg::DependenceGraph<dg::LLVMNode>*>,std::allocator<dg::DependenceGraph<dg::LLVMNode>*>>
                  *)&this->subgraphs,(DependenceGraph<dg::LLVMNode> **)&local_48);
    }
  }
  std::
  __shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_48,
                 &(this->dg->global_nodes).
                  super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_38 = (DependenceGraph<dg::LLVMNode> *)local_48._M_ptr;
  pVar6 = std::
          _Rb_tree<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::_Identity<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::less<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::allocator<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>>
          ::
          _M_insert_unique<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>
                    ((_Rb_tree<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::_Identity<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::less<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::allocator<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>>
                      *)&this->dumpedGlobals,
                     (map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
                      **)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::
    __shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_48,
                   &(this->dg->global_nodes).
                    super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
    peVar2 = local_48._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    for (pLVar5 = *(LLVMNode **)((long)peVar2 + 0x18);
        pLVar5 != (LLVMNode *)&(peVar2->_M_t)._M_impl.super__Rb_tree_header;
        pLVar5 = (LLVMNode *)std::_Rb_tree_increment((_Rb_tree_node_base *)pLVar5)) {
      dump_node(this,*(LLVMNode **)
                      ((long)&(pLVar5->
                              super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                              controlDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
                              _M_impl.super__Rb_tree_header + 0x10),1,"GL");
    }
  }
  return;
}

Assistant:

void dump_nodes() {
        out << "\t/* nodes */\n";
        for (auto &I : *dg) {
            auto *node = I.second;

            dump_node(node);

            for (auto subgraph : node->getSubgraphs()) {
                subgraphs.insert(subgraph);
            }
        }

        if (dumpedGlobals.insert(dg->getGlobalNodes().get()).second)
            for (auto &I : *dg->getGlobalNodes())
                dump_node(I.second, 1, "GL");
    }